

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

Month month_of_day(DaysInYear days_in_year)

{
  bool bVar1;
  Month MVar2;
  uint uVar3;
  
  days_in_months(days_in_year.year);
  bVar1 = leapyear(days_in_year.year);
  uVar3 = days_in_year.days;
  if ((int)uVar3 < 0x1f) {
    MVar2 = jan;
  }
  else if (uVar3 < bVar1 + 0x3b) {
    MVar2 = feb;
  }
  else if (uVar3 < bVar1 + 0x5a) {
    MVar2 = mar;
  }
  else if (uVar3 < bVar1 + 0x78) {
    MVar2 = apr;
  }
  else if (uVar3 < bVar1 + 0x97) {
    MVar2 = may;
  }
  else if (uVar3 < bVar1 + 0xb5) {
    MVar2 = jun;
  }
  else if (uVar3 < bVar1 + 0xd4) {
    MVar2 = jul;
  }
  else if (uVar3 < bVar1 + 0xf3) {
    MVar2 = aug;
  }
  else if (uVar3 < bVar1 + 0x111) {
    MVar2 = sep;
  }
  else if (uVar3 < bVar1 + 0x130) {
    MVar2 = oct;
  }
  else {
    MVar2 = dec - (uVar3 < (bVar1 | 0x14e));
  }
  return MVar2;
}

Assistant:

Month month_of_day(DaysInYear days_in_year)
{
	auto d = days_in_year.days;
	auto y = days_in_year.year;
	auto months = days_in_months(y);
	auto leap_additive = leapyear(y) ? 1 : 0;
	if (d < 31)
		return Month::jan;
	else if (d < 59 + leap_additive)
		return Month::feb;
	else if (d < 90 + leap_additive)
		return Month::mar;
	else if (d < 120 + leap_additive)
		return Month::apr;
	else if (d < 151 + leap_additive)
		return Month::may;
	else if (d < 181 + leap_additive)
		return Month::jun;
	else if (d < 212 + leap_additive)
		return Month::jul;
	else if (d < 243 + leap_additive)
		return Month::aug;
	else if (d < 273 + leap_additive)
		return Month::sep;
	else if (d < 304 + leap_additive)
		return Month::oct;
	else if (d < 334 + leap_additive)
		return Month::nov;
	else
		return Month::dec;
}